

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_resolver.cpp
# Opt level: O2

int __thiscall
zmq::ip_resolver_t::resolve_nic_name(ip_resolver_t *this,ip_addr_t *ip_addr_,char *nic_)

{
  short sVar1;
  short *__src;
  bool bVar2;
  int iVar3;
  int *piVar4;
  char *errmsg_;
  size_t __n;
  int i;
  int iVar5;
  ifaddrs **ppiVar6;
  ifaddrs *ifa;
  
  ppiVar6 = &ifa;
  ifa = (ifaddrs *)0x0;
  bVar2 = true;
  for (iVar5 = 0; iVar5 != 10; iVar5 = iVar5 + 1) {
    iVar3 = getifaddrs(&ifa);
    if (iVar3 == 0) goto LAB_001bd68b;
    if (iVar3 < 0) {
      piVar4 = __errno_location();
      iVar3 = *piVar4;
      if (iVar3 != 0x6f) goto LAB_001bd637;
    }
    usleep(1000 << ((byte)iVar5 & 0x1f));
    bVar2 = false;
  }
  if (!bVar2) {
    piVar4 = __errno_location();
    iVar3 = *piVar4;
LAB_001bd637:
    if ((iVar3 == 0x5f) || (iVar3 == 0x16)) goto LAB_001bd706;
    errmsg_ = strerror(iVar3);
    fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ip_resolver.cpp"
            ,0x21e);
    fflush(_stderr);
    zmq_abort(errmsg_);
  }
LAB_001bd68b:
  if (ifa == (ifaddrs *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","ifa != NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ip_resolver.cpp"
            ,0x21f);
    fflush(_stderr);
    zmq_abort("ifa != NULL");
  }
  bVar2 = (this->_options)._ipv6_wanted;
  while (ppiVar6 = &(*ppiVar6)->ifa_next, ppiVar6 != (ifaddrs **)0x0) {
    __src = (short *)((long *)ppiVar6)[3];
    if (((__src != (short *)0x0) && (sVar1 = *__src, (ushort)((bVar2 & 1) * 8 + 2) == sVar1)) &&
       (iVar5 = strcmp(nic_,(char *)((long *)ppiVar6)[1]), iVar5 == 0)) {
      __n = 0x1c;
      if (sVar1 == 2) {
        __n = 0x10;
      }
      memcpy(ip_addr_,__src,__n);
      freeifaddrs(ifa);
      return 0;
    }
  }
  freeifaddrs(ifa);
  piVar4 = __errno_location();
LAB_001bd706:
  *piVar4 = 0x13;
  return -1;
}

Assistant:

int zmq::ip_resolver_t::resolve_nic_name (ip_addr_t *ip_addr_, const char *nic_)
{
    //  Get the addresses.
    ifaddrs *ifa = NULL;
    int rc = 0;
    const int max_attempts = 10;
    const int backoff_msec = 1;
    for (int i = 0; i < max_attempts; i++) {
        rc = getifaddrs (&ifa);
        if (rc == 0 || (rc < 0 && errno != ECONNREFUSED))
            break;
        usleep ((backoff_msec << i) * 1000);
    }

    if (rc != 0 && ((errno == EINVAL) || (errno == EOPNOTSUPP))) {
        // Windows Subsystem for Linux compatibility
        errno = ENODEV;
        return -1;
    }
    errno_assert (rc == 0);
    zmq_assert (ifa != NULL);

    //  Find the corresponding network interface.
    bool found = false;
    for (const ifaddrs *ifp = ifa; ifp != NULL; ifp = ifp->ifa_next) {
        if (ifp->ifa_addr == NULL)
            continue;

        const int family = ifp->ifa_addr->sa_family;
        if (family == (_options.ipv6 () ? AF_INET6 : AF_INET)
            && !strcmp (nic_, ifp->ifa_name)) {
            memcpy (ip_addr_, ifp->ifa_addr,
                    (family == AF_INET) ? sizeof (struct sockaddr_in)
                                        : sizeof (struct sockaddr_in6));
            found = true;
            break;
        }
    }

    //  Clean-up;
    freeifaddrs (ifa);

    if (!found) {
        errno = ENODEV;
        return -1;
    }
    return 0;
}